

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 IVar1;
  ImVec2 local_50;
  ImRect local_48;
  ImVec1 local_38;
  ImVec1 local_34;
  ImVec1 local_30;
  ImVec2 local_2c;
  ImVec2 local_24 [2];
  ImGuiWindowTempData *local_10;
  ImGuiWindowTempData *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->CursorPos);
  ImVec2::ImVec2(&this->CursorPosPrevLine);
  ImVec2::ImVec2(&this->CursorStartPos);
  ImVec2::ImVec2(&this->CursorMaxPos);
  ImVec2::ImVec2(&this->CurrLineSize);
  ImVec2::ImVec2(&this->PrevLineSize);
  ImVec1::ImVec1(&this->Indent);
  ImVec1::ImVec1(&this->ColumnsOffset);
  ImVec1::ImVec1(&this->GroupOffset);
  ImRect::ImRect(&this->LastItemRect);
  ImRect::ImRect(&this->LastItemDisplayRect);
  ImVec2::ImVec2(&this->MenuBarOffset);
  ImGuiMenuColumns::ImGuiMenuColumns(&this->MenuColumns);
  ImVector<ImGuiWindow_*>::ImVector(&this->ChildWindows);
  ImVector<int>::ImVector(&this->ItemFlagsStack);
  ImVector<float>::ImVector(&this->ItemWidthStack);
  ImVector<float>::ImVector(&this->TextWrapPosStack);
  ImVector<ImGuiGroupData>::ImVector(&this->GroupStack);
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->CursorMaxPos = local_24[0];
  this->CursorStartPos = this->CursorMaxPos;
  this->CursorPosPrevLine = this->CursorStartPos;
  this->CursorPos = this->CursorPosPrevLine;
  ImVec2::ImVec2(&local_2c,0.0,0.0);
  this->PrevLineSize = local_2c;
  this->CurrLineSize = this->PrevLineSize;
  this->PrevLineTextBaseOffset = 0.0;
  this->CurrLineTextBaseOffset = 0.0;
  ImVec1::ImVec1(&local_30,0.0);
  (this->Indent).x = local_30.x;
  ImVec1::ImVec1(&local_34,0.0);
  (this->ColumnsOffset).x = local_34.x;
  ImVec1::ImVec1(&local_38,0.0);
  (this->GroupOffset).x = local_38.x;
  this->LastItemId = 0;
  this->LastItemStatusFlags = 0;
  ImRect::ImRect(&local_48);
  (this->LastItemDisplayRect).Min = local_48.Min;
  (this->LastItemDisplayRect).Max = local_48.Max;
  IVar1 = (this->LastItemDisplayRect).Max;
  (this->LastItemRect).Min = (this->LastItemDisplayRect).Min;
  (this->LastItemRect).Max = IVar1;
  this->NavLayerActiveMaskNext = 0;
  this->NavLayerActiveMask = 0;
  this->NavLayerCurrent = ImGuiNavLayer_Main;
  this->NavLayerCurrentMask = 1;
  this->NavFocusScopeIdCurrent = 0;
  this->NavHideHighlightOneFrame = false;
  this->NavHasScroll = false;
  this->MenuBarAppending = false;
  ImVec2::ImVec2(&local_50,0.0,0.0);
  this->MenuBarOffset = local_50;
  this->TreeDepth = 0;
  this->TreeJumpToParentOnPopMask = 0;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->CurrentColumns = (ImGuiColumns *)0x0;
  this->ParentLayoutType = 1;
  this->LayoutType = 1;
  this->FocusCounterTabStop = -1;
  this->FocusCounterRegular = -1;
  this->ItemFlags = 0;
  this->ItemWidth = 0.0;
  this->TextWrapPos = -1.0;
  memset(this->StackSizesBackup,0,0xc);
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        Indent = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);

        LastItemId = 0;
        LastItemStatusFlags = ImGuiItemStatusFlags_None;
        LastItemRect = LastItemDisplayRect = ImRect();

        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavFocusScopeIdCurrent = 0;
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;

        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        TreeDepth = 0;
        TreeJumpToParentOnPopMask = 0x00;
        StateStorage = NULL;
        CurrentColumns = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        FocusCounterRegular = FocusCounterTabStop = -1;

        ItemFlags = ImGuiItemFlags_Default_;
        ItemWidth = 0.0f;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));
    }